

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5SegIterSeekInit(Fts5Index *p,u8 *pTerm,int nTerm,int flags,Fts5StructureSegment *pSeg,
                        Fts5SegIter *pIter)

{
  int *pRc;
  sqlite3_mutex *psVar1;
  Fts5StructureSegment *pFVar2;
  bool bVar3;
  Fts5Data *p_00;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  u32 uVar11;
  char *zSql;
  Mem *pMem;
  ulong uVar12;
  Fts5Data *pFVar13;
  Fts5Data *pFVar14;
  code *pcVar15;
  long lVar16;
  u8 *puVar17;
  long lVar18;
  uint uVar19;
  u32 uVar20;
  u32 nData;
  Vdbe *p_1;
  Vdbe *p_01;
  long in_FS_OFFSET;
  bool bVar21;
  u32 nKeep;
  int ret;
  uint local_94;
  ulong local_88;
  uint local_74;
  u32 local_4c;
  u32 local_48;
  uint local_44;
  u32 local_40;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIter->pSeg = (Fts5StructureSegment *)0x0;
  pIter->flags = 0;
  pIter->iLeafPgno = 0;
  pIter->iRowid = 0;
  pIter->nPos = 0;
  pIter->bDel = '\0';
  *(undefined3 *)&pIter->field_0x7d = 0;
  (pIter->term).p = (u8 *)0x0;
  (pIter->term).n = 0;
  (pIter->term).nSpace = 0;
  pIter->aRowidOffset = (int *)0x0;
  pIter->pDlidx = (Fts5DlidxIter *)0x0;
  pIter->iPgidxOff = 0;
  pIter->iEndofDoclist = 0;
  pIter->iRowidOffset = 0;
  pIter->nRowidOffset = 0;
  pIter->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
  pIter->iTermLeafPgno = 0;
  pIter->iTermLeafOffset = 0;
  pIter->iLeafOffset = 0;
  pIter->pTombArray = (Fts5TombstoneArray *)0x0;
  pIter->pLeaf = (Fts5Data *)0x0;
  pIter->pNextLeaf = (Fts5Data *)0x0;
  pIter->pSeg = pSeg;
  p_01 = (Vdbe *)p->pIdxSelect;
  if (p_01 == (Vdbe *)0x0) {
    zSql = sqlite3_mprintf("SELECT pgno FROM \'%q\'.\'%q_idx\' WHERE segid=? AND term<=? ORDER BY term DESC LIMIT 1"
                           ,p->pConfig->zDb,p->pConfig->zName);
    fts5IndexPrepareStmt(p,&p->pIdxSelect,zSql);
    p_01 = (Vdbe *)p->pIdxSelect;
  }
  if (p->rc == 0) {
    pRc = &p->rc;
    iVar7 = 1;
    sqlite3_bind_int64((sqlite3_stmt *)p_01,1,(long)pSeg->iSegid);
    bindText((sqlite3_stmt *)p_01,2,pTerm,(long)nTerm,(_func_void_void_ptr *)0x0,'\0');
    iVar6 = sqlite3_step((sqlite3_stmt *)p_01);
    bVar21 = true;
    if (iVar6 == 100) {
      pMem = columnMem((sqlite3_stmt *)p_01,0);
      uVar12 = sqlite3VdbeIntValue(pMem);
      columnMallocFailure((sqlite3_stmt *)p_01);
      iVar7 = (int)uVar12 >> 1;
      bVar21 = (uVar12 & 1) == 0;
    }
    iVar6 = sqlite3_reset((sqlite3_stmt *)p_01);
    *pRc = iVar6;
    iVar6 = vdbeUnbind(p_01,1);
    if ((iVar6 == 0) && (psVar1 = p_01->db->mutex, psVar1 != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar1);
    }
    iVar6 = pSeg->pgnoFirst;
    iVar8 = iVar6;
    if (iVar6 < iVar7) {
      iVar8 = iVar7;
    }
    pIter->iLeafPgno = iVar8 + -1;
    fts5SegIterNextPage(p,pIter);
    pFVar13 = pIter->pLeaf;
    if (pFVar13 != (Fts5Data *)0x0) {
      puVar17 = pFVar13->p;
      local_74 = pFVar13->nn;
      local_40 = 0;
      local_48 = 0xaaaaaaaa;
      local_94 = pFVar13->szLeaf;
      iVar8 = sqlite3Fts5GetVarint32(puVar17 + local_94,&local_48);
      if (local_74 < local_48) goto LAB_001e50c4;
      local_94 = iVar8 + local_94;
      nData = 0;
      uVar20 = local_48;
      uVar11 = local_48;
LAB_001e50e6:
      local_44 = (uint)puVar17[uVar20];
      if ((char)puVar17[uVar20] < '\0') {
        iVar8 = sqlite3Fts5GetVarint32(puVar17 + uVar20,&local_44);
        uVar19 = uVar20 + iVar8;
      }
      else {
        uVar19 = uVar20 + 1;
      }
      uVar20 = local_40;
      if (local_40 < nData) {
LAB_001e52e4:
        nData = uVar20;
        local_48 = uVar11;
        local_3c = uVar19;
        if ((flags & 8U) != 0) goto LAB_001e54eb;
LAB_001e52fc:
        local_3c = uVar19;
        sqlite3_free(pFVar13);
        pIter->pLeaf = (Fts5Data *)0x0;
        goto LAB_001e5322;
      }
      uVar9 = nData;
      if (local_40 == nData) {
        uVar9 = nTerm - nData;
        if (local_44 < nTerm - nData) {
          uVar9 = local_44;
        }
        if (uVar9 == 0) {
          uVar10 = 0;
        }
        else {
          uVar12 = 0;
          do {
            uVar10 = (uint)uVar12;
            if (puVar17[uVar19 + uVar10] != pTerm[nData + uVar10]) break;
            uVar12 = uVar12 + 1;
            uVar10 = uVar9;
          } while (uVar9 != uVar12);
        }
        uVar9 = uVar10 + nData;
        uVar20 = nData;
        if (uVar9 != nTerm) {
          if ((local_44 <= uVar10) || (puVar17[uVar10 + uVar19] <= pTerm[uVar9])) goto LAB_001e51a1;
          goto LAB_001e52e4;
        }
        local_48 = uVar11;
        local_3c = uVar19;
        if (uVar10 == local_44) goto LAB_001e54eb;
        goto LAB_001e52e4;
      }
LAB_001e51a1:
      nData = uVar9;
      if (local_74 <= local_94) {
        local_3c = uVar19;
        if ((flags & 8U) == 0) goto LAB_001e52fc;
        goto LAB_001e5229;
      }
      iVar8 = sqlite3Fts5GetVarint32(puVar17 + local_94,&local_40);
      uVar11 = uVar11 + local_40;
      if (uVar11 < local_74) {
        local_94 = local_94 + iVar8;
        uVar20 = uVar11 + 1;
        local_40 = (u32)puVar17[uVar11];
        if ((char)puVar17[uVar11] < '\0') {
          iVar8 = sqlite3Fts5GetVarint32(puVar17 + uVar11,&local_40);
          uVar20 = iVar8 + uVar11;
        }
        goto LAB_001e50e6;
      }
      *pRc = 0x10b;
    }
    goto LAB_001e5322;
  }
  goto LAB_001e5676;
  while( true ) {
    local_94 = pFVar13->szLeaf;
    local_74 = pFVar13->nn;
    if ((int)local_94 < (int)local_74) break;
LAB_001e5229:
    fts5SegIterNextPage(p,pIter);
    pFVar13 = pIter->pLeaf;
    if (pFVar13 == (Fts5Data *)0x0) goto LAB_001e5322;
  }
  puVar17 = pFVar13->p;
  iVar8 = sqlite3Fts5GetVarint32(puVar17 + local_94,&local_3c);
  uVar11 = local_3c;
  uVar12 = (ulong)local_3c;
  if ((3 < uVar12) && ((long)uVar12 < (long)(int)local_94)) {
    local_94 = iVar8 + local_94;
    local_40 = 0;
    local_48 = local_3c;
    iVar8 = sqlite3Fts5GetVarint32(puVar17 + uVar12,&local_44);
    nData = 0;
    local_3c = iVar8 + uVar11;
LAB_001e54eb:
    uVar19 = local_44;
    if (((ulong)local_44 != 0) && (uVar12 = (ulong)local_3c, local_44 + uVar12 <= (ulong)local_74))
    {
      pIter->iLeafOffset = (ulong)(local_44 + local_3c);
      pIter->iTermLeafOffset = local_44 + local_3c;
      pIter->iTermLeafPgno = pIter->iLeafPgno;
      (pIter->term).n = 0;
      sqlite3Fts5BufferAppendBlob(pRc,&pIter->term,nData,pTerm);
      sqlite3Fts5BufferAppendBlob(pRc,&pIter->term,uVar19,puVar17 + uVar12);
      if (local_94 < local_74) {
        local_4c = 0xaaaaaaaa;
        iVar8 = sqlite3Fts5GetVarint32(puVar17 + local_94,&local_4c);
        local_94 = local_94 + iVar8;
        iVar8 = uVar11 + local_4c;
      }
      else {
        iVar8 = pIter->pLeaf->nn + 1;
      }
      pIter->iEndofDoclist = iVar8;
      pIter->iPgidxOff = local_94;
      fts5SegIterLoadRowid(p,pIter);
      fts5SegIterLoadNPos(p,pIter);
      goto LAB_001e5322;
    }
  }
LAB_001e50c4:
  *pRc = 0x10b;
LAB_001e5322:
  if (((flags & 0x108U) != 8) && (*pRc == 0)) {
    uVar19 = pIter->flags;
    pIter->flags = uVar19 | 1;
    if (pIter->pLeaf != (Fts5Data *)0x0) {
      if ((flags & 2U) != 0) {
        pIter->flags = uVar19 | 3;
      }
      if (iVar6 <= iVar7 && !bVar21) {
        fts5SegIterLoadDlidx(p,pIter);
      }
      if ((flags & 2U) != 0) {
        if ((pIter->pDlidx == (Fts5DlidxIter *)0x0) || (p->pConfig->iVersion != 4)) {
          uVar12 = (ulong)pIter->iLeafPgno;
          iVar6 = 4;
          if (pIter->iTermLeafPgno == pIter->iLeafPgno) {
            iVar6 = pIter->iTermLeafOffset;
          }
          lVar16 = (long)iVar6 << 0x20;
          lVar18 = (long)iVar6;
          do {
            lVar16 = lVar16 + 0x100000000;
            if (-1 < (char)pIter->pLeaf->p[lVar18]) break;
            bVar21 = lVar18 < iVar6 + 8;
            lVar18 = lVar18 + 1;
          } while (bVar21);
          pIter->iLeafOffset = lVar16 >> 0x20;
          if (pIter->pLeaf->szLeaf <= pIter->iEndofDoclist) {
            pFVar2 = pIter->pSeg;
            local_88 = 0;
            pFVar13 = (Fts5Data *)0x0;
            do {
              do {
                iVar6 = (int)local_88;
                if ((*pRc != 0) || ((long)pFVar2->pgnoLast <= (long)uVar12)) goto LAB_001e53c1;
                pFVar14 = fts5LeafRead(p,uVar12 + ((ulong)(uint)pFVar2->iSegid << 0x25) + 1);
                uVar12 = uVar12 + 1;
              } while (pFVar14 == (Fts5Data *)0x0);
              iVar7 = pFVar14->szLeaf;
              bVar21 = pFVar14->p[1] != '\0';
              bVar3 = *pFVar14->p != '\0';
              iVar8 = pFVar14->nn;
              p_00 = pFVar14;
              if (bVar21 || bVar3) {
                local_88 = uVar12;
                p_00 = pFVar13;
              }
              iVar6 = (int)local_88;
              if (bVar21 || bVar3) {
                pFVar13 = pFVar14;
              }
              sqlite3_free(p_00);
              local_88 = local_88 & 0xffffffff;
            } while (iVar8 <= iVar7);
            goto LAB_001e53c1;
          }
        }
        else {
          iVar6 = pIter->pDlidx->aLvl[0].iLeafPgno;
          pFVar13 = fts5LeafRead(p,((ulong)(uint)pIter->pSeg->iSegid << 0x25) + (long)iVar6);
LAB_001e53c1:
          local_88._0_4_ = iVar6;
          if (pFVar13 != (Fts5Data *)0x0) {
            sqlite3_free(pIter->pLeaf);
            pIter->pLeaf = pFVar13;
            pIter->iLeafPgno = (int)local_88;
            uVar5 = *(ushort *)pFVar13->p;
            uVar5 = uVar5 << 8 | uVar5 >> 8;
            if (pFVar13->szLeaf < (int)(uint)uVar5) {
              *pRc = 0x10b;
              goto LAB_001e561c;
            }
            bVar4 = sqlite3Fts5GetVarint
                              ((uchar *)((long)pFVar13->p + (ulong)uVar5),(u64 *)&pIter->iRowid);
            pIter->iLeafOffset = (ulong)((uint)bVar4 + (uint)uVar5);
            if (pFVar13->szLeaf < pFVar13->nn) {
              local_3c = 0xaaaaaaaa;
              sqlite3Fts5GetVarint32(pFVar13->p + pFVar13->szLeaf,&local_3c);
              uVar11 = local_3c;
            }
            else {
              uVar11 = pFVar13->nn + 1;
            }
            pIter->iEndofDoclist = uVar11;
          }
        }
        fts5SegIterReverseInitPage(p,pIter);
      }
    }
  }
LAB_001e561c:
  if ((pIter->flags & 2) == 0) {
    if (p->pConfig->eDetail == 1) {
      pcVar15 = fts5SegIterNext_None;
    }
    else {
      pcVar15 = fts5SegIterNext;
    }
  }
  else {
    pcVar15 = fts5SegIterNext_Reverse;
  }
  pIter->xNext = pcVar15;
  if (((uint)flags >> 8 & 1) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      fts5SegIterAllocTombstone(p,pIter);
      return;
    }
    goto LAB_001e5695;
  }
LAB_001e5676:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001e5695:
  __stack_chk_fail();
}

Assistant:

static void fts5SegIterSeekInit(
  Fts5Index *p,                   /* FTS5 backend */
  const u8 *pTerm, int nTerm,     /* Term to seek to */
  int flags,                      /* Mask of FTS5INDEX_XXX flags */
  Fts5StructureSegment *pSeg,     /* Description of segment */
  Fts5SegIter *pIter              /* Object to populate */
){
  int iPg = 1;
  int bGe = (flags & FTS5INDEX_QUERY_SCAN);
  int bDlidx = 0;                 /* True if there is a doclist-index */
  sqlite3_stmt *pIdxSelect = 0;

  assert( bGe==0 || (flags & FTS5INDEX_QUERY_DESC)==0 );
  assert( pTerm && nTerm );
  memset(pIter, 0, sizeof(*pIter));
  pIter->pSeg = pSeg;

  /* This block sets stack variable iPg to the leaf page number that may
  ** contain term (pTerm/nTerm), if it is present in the segment. */
  pIdxSelect = fts5IdxSelectStmt(p);
  if( p->rc ) return;
  sqlite3_bind_int(pIdxSelect, 1, pSeg->iSegid);
  sqlite3_bind_blob(pIdxSelect, 2, pTerm, nTerm, SQLITE_STATIC);
  if( SQLITE_ROW==sqlite3_step(pIdxSelect) ){
    i64 val = sqlite3_column_int(pIdxSelect, 0);
    iPg = (int)(val>>1);
    bDlidx = (val & 0x0001);
  }
  p->rc = sqlite3_reset(pIdxSelect);
  sqlite3_bind_null(pIdxSelect, 2);

  if( iPg<pSeg->pgnoFirst ){
    iPg = pSeg->pgnoFirst;
    bDlidx = 0;
  }

  pIter->iLeafPgno = iPg - 1;
  fts5SegIterNextPage(p, pIter);

  if( pIter->pLeaf ){
    fts5LeafSeek(p, bGe, pIter, pTerm, nTerm);
  }

  if( p->rc==SQLITE_OK && (bGe==0 || (flags & FTS5INDEX_QUERY_SCANONETERM)) ){
    pIter->flags |= FTS5_SEGITER_ONETERM;
    if( pIter->pLeaf ){
      if( flags & FTS5INDEX_QUERY_DESC ){
        pIter->flags |= FTS5_SEGITER_REVERSE;
      }
      if( bDlidx ){
        fts5SegIterLoadDlidx(p, pIter);
      }
      if( flags & FTS5INDEX_QUERY_DESC ){
        fts5SegIterReverse(p, pIter);
      }
    }
  }

  fts5SegIterSetNext(p, pIter);
  if( 0==(flags & FTS5INDEX_QUERY_SCANONETERM) ){
    fts5SegIterAllocTombstone(p, pIter);
  }

  /* Either:
  **
  **   1) an error has occurred, or
  **   2) the iterator points to EOF, or
  **   3) the iterator points to an entry with term (pTerm/nTerm), or
  **   4) the FTS5INDEX_QUERY_SCAN flag was set and the iterator points
  **      to an entry with a term greater than or equal to (pTerm/nTerm).
  */
  assert_nc( p->rc!=SQLITE_OK                                       /* 1 */
   || pIter->pLeaf==0                                               /* 2 */
   || fts5BufferCompareBlob(&pIter->term, pTerm, nTerm)==0          /* 3 */
   || (bGe && fts5BufferCompareBlob(&pIter->term, pTerm, nTerm)>0)  /* 4 */
  );
}